

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O3

Mtbdd __thiscall sylvan::Mtbdd::AbstractMin(Mtbdd *this,BddSet *variables)

{
  char *in_RDX;
  undefined1 local_50 [64];
  
  local_50._16_8_ = (variables->set).bdd;
  local_50._24_8_ = *(undefined8 *)in_RDX;
  local_50._0_8_ = mtbdd_abstract_WRAP;
  local_50._8_8_ = (__pointer_type)0x1;
  local_50._32_8_ = mtbdd_abstract_op_min_CALL;
  lace_run_task((Task *)local_50);
  this->mtbdd = local_50._16_8_;
  mtbdd_protect(&this->mtbdd);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::AbstractMin(const BddSet &variables) const
{
    return mtbdd_abstract_min(mtbdd, variables.set.bdd);
}